

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cc
# Opt level: O0

__pid_t __thiscall muduo::CountDownLatch::wait(CountDownLatch *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  MutexLock *__stat_loc_00;
  MutexLockGuard lock;
  MutexLockGuard *in_stack_ffffffffffffffe0;
  
  __stat_loc_00 = &this->mutex_;
  MutexLockGuard::MutexLockGuard(in_stack_ffffffffffffffe0,(MutexLock *)this);
  while (0 < this->count_) {
    Condition::wait(&this->condition_,__stat_loc_00);
  }
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x150b3f);
  return extraout_EAX;
}

Assistant:

void CountDownLatch::wait()
{
  MutexLockGuard lock(mutex_);
  while (count_ > 0)
  {
    condition_.wait();
  }
}